

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::IfStmt::add_else_stmt(IfStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  StmtException *this_00;
  initializer_list<kratos::IRNode_*> __l;
  IfStmt *local_70;
  string local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  allocator_type local_29;
  
  if (((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ != Block)
  {
    StmtBlock::add_stmt(&((this->else_body_).
                          super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_StmtBlock,stmt);
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"cannot add statement block to the if statement body","");
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  local_70 = this;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_48,__l,&local_29);
  StmtException::StmtException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IfStmt::add_else_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (stmt->type() == StatementType::Block)
        throw StmtException("cannot add statement block to the if statement body", {this});
    else_body_->add_stmt(stmt);
}